

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O3

int match_ip(ip_rule_t *ipr,packet_t *pkt)

{
  byte bVar1;
  char cVar2;
  ip_t *piVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  uVar4 = 0;
  if (pkt->eth_type == 0x800) {
    piVar3 = pkt->ip;
    bVar1 = ipr->invert;
    if (((((ipr->smsk).s_addr & piVar3->src) == (ipr->src).s_addr) != (bool)(bVar1 & 1)) &&
       (((bVar1 & 2) == 0) != (((ipr->dmsk).s_addr & piVar3->dst) != (ipr->dst).s_addr))) {
      bVar7 = true;
      if (ipr->in[0] != '\0') {
        lVar5 = 0;
        while (cVar2 = ipr->in[lVar5], cVar2 != '+') {
          if (cVar2 != (pkt->iface).in[lVar5]) {
            bVar7 = false;
            break;
          }
          if ((cVar2 == '\0') || (bVar6 = lVar5 == 0xf, lVar5 = lVar5 + 1, bVar6)) break;
        }
      }
      if (bVar7 != ((bVar1 >> 2 & 1) != 0)) {
        bVar7 = true;
        if (ipr->out[0] != '\0') {
          lVar5 = 0;
          while (cVar2 = ipr->out[lVar5], cVar2 != '+') {
            if (cVar2 != (pkt->iface).out[lVar5]) {
              bVar7 = false;
              break;
            }
            if ((cVar2 == '\0') || (bVar6 = lVar5 == 0xf, lVar5 = lVar5 + 1, bVar6)) break;
          }
        }
        if ((bVar7 != ((bVar1 >> 3 & 1) != 0)) &&
           ((ipr->proto == '\0' || (((bVar1 & 0x10) == 0) != (pkt->ip_proto != ipr->proto))))) {
          bVar7 = false;
          if ((piVar3->frag & 0xff1f) == 0) {
            bVar7 = ipr->frag != '\0';
          }
          uVar4 = (uint)(bVar7 == ((bVar1 >> 5 & 1) != 0));
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int match_ip(ip_rule_t *ipr, packet_t *pkt)
{
	if (pkt->eth_type != ETH_IP) {
		return 0;
	}

	if (INVF(ipr, INV_SRC, (pkt->ip->src & ipr->smsk.s_addr) != ipr->src.s_addr) ||
		INVF(ipr, INV_DST, (pkt->ip->dst & ipr->dmsk.s_addr) != ipr->dst.s_addr)) {
		return 0;
	}

	if (INVF(ipr, INV_IN, !match_iface(ipr->in, pkt->iface.in))) {
		return 0;
	}

	if (INVF(ipr, INV_OUT, !match_iface(ipr->out, pkt->iface.out))) {
		return 0;
	}

	if (ipr->proto && INVF(ipr, INV_PROTO, pkt->ip_proto != ipr->proto)) {
		return 0;
	}

	if (INVF(ipr, INV_FRAG, !IP_FRAGOFF(pkt->ip) && ipr->frag)) {
		return 0;
	}

	return 1;
}